

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O3

void ncnn::transpose_pack_A_tile_int8_avx512vnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  void *pvVar6;
  undefined1 (*pauVar7) [64];
  undefined1 (*pauVar8) [64];
  int iVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  ulong *puVar14;
  undefined1 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 in_ZMM5 [64];
  long local_78;
  long local_70;
  
  pauVar7 = (undefined1 (*) [64])AT->data;
  iVar9 = A->w;
  lVar31 = (long)iVar9;
  uVar36 = 0;
  lVar21 = (long)k;
  lVar29 = (long)i;
  if (0xf < max_ii) {
    lVar26 = (long)(iVar9 * 4);
    lVar17 = iVar9 * 3 + lVar29;
    lVar34 = lVar29 + iVar9 * 2;
    lVar10 = lVar29 + lVar31;
    auVar40 = vpbroadcastd_avx512f(ZEXT416(0x7f7f7f7f));
    uVar20 = 0;
    lVar32 = lVar29;
    do {
      pvVar6 = A->data;
      lVar22 = A->w * lVar21 * A->elemsize;
      if (max_kk < 4) {
        lVar19 = (long)pvVar6 + lVar29 + uVar20;
        uVar35 = 0;
      }
      else {
        lVar19 = (long)pvVar6 + lVar32;
        lVar28 = (long)pvVar6 + lVar17;
        lVar18 = (long)pvVar6 + lVar34;
        lVar11 = (long)pvVar6 + lVar10;
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        iVar23 = 3;
        pauVar7 = pauVar7 + 1;
        do {
          pauVar8 = pauVar7;
          auVar38 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar19 + lVar22),
                                   *(undefined1 (*) [16])(lVar11 + lVar22));
          auVar45 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar19 + lVar22),
                                   *(undefined1 (*) [16])(lVar11 + lVar22));
          auVar49 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar18 + lVar22),
                                   *(undefined1 (*) [16])(lVar28 + lVar22));
          auVar37 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar18 + lVar22),
                                   *(undefined1 (*) [16])(lVar28 + lVar22));
          auVar43 = vpunpcklwd_avx(auVar38,auVar49);
          in_ZMM5 = ZEXT1664(auVar43);
          auVar38 = vpunpckhwd_avx(auVar38,auVar49);
          auVar49 = vpunpcklwd_avx(auVar45,auVar37);
          auVar45 = vpunpckhwd_avx(auVar45,auVar37);
          auVar39._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar49;
          auVar39._16_16_ = ZEXT116(1) * auVar45;
          auVar41 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar38,
                                                   ZEXT116(0) * auVar38 + ZEXT116(1) * auVar43)),
                               auVar39,1);
          auVar44 = vpdpbusd_avx512_vnni(auVar44,auVar40,auVar41);
          auVar41 = vmovdqu64_avx512f(auVar41);
          pauVar8[-1] = auVar41;
          pauVar7 = pauVar8 + 1;
          lVar19 = lVar19 + lVar26;
          lVar28 = lVar28 + lVar26;
          lVar18 = lVar18 + lVar26;
          lVar11 = lVar11 + lVar26;
          iVar23 = iVar23 + 4;
        } while (iVar23 < max_kk);
        auVar44 = vmovdqu64_avx512f(auVar44);
        *pauVar8 = auVar44;
        uVar35 = max_kk & 0xfffffffc;
      }
      pauVar12 = (undefined1 (*) [16])(lVar19 + lVar22);
      uVar24 = uVar35 | 1;
      while ((int)uVar24 < max_kk) {
        auVar37 = vpunpcklbw_avx(*pauVar12,*(undefined1 (*) [16])(*pauVar12 + lVar31));
        auVar45 = vpunpckhbw_avx(*pauVar12,*(undefined1 (*) [16])(*pauVar12 + lVar31));
        *(undefined1 (*) [16])*pauVar7 = auVar37;
        *(undefined1 (*) [16])(*pauVar7 + 0x10) = auVar45;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
        pauVar12 = (undefined1 (*) [16])(*pauVar12 + iVar9 * 2);
        uVar24 = uVar35 + 3;
        uVar35 = uVar35 + 2;
      }
      iVar23 = max_kk - uVar35;
      if (iVar23 != 0 && (int)uVar35 <= max_kk) {
        do {
          *(undefined1 (*) [16])*pauVar7 = *pauVar12;
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar31);
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar36 = uVar20 + 0x10;
      uVar30 = uVar20 + 0x1f;
      lVar32 = lVar32 + 0x10;
      lVar17 = lVar17 + 0x10;
      lVar34 = lVar34 + 0x10;
      lVar10 = lVar10 + 0x10;
      uVar20 = uVar36;
    } while (uVar30 < (uint)max_ii);
  }
  lVar34 = (long)max_ii;
  if ((int)((uint)uVar36 | 7) < max_ii) {
    lVar26 = (long)(iVar9 * 4);
    lVar10 = lVar29 + (uVar36 & 0xffffffff);
    lVar22 = iVar9 * 3 + lVar10;
    lVar32 = lVar10 + iVar9 * 2;
    lVar17 = lVar10 + lVar31;
    auVar42._8_4_ = 0x7f7f7f7f;
    auVar42._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar42._12_4_ = 0x7f7f7f7f;
    auVar42._16_4_ = 0x7f7f7f7f;
    auVar42._20_4_ = 0x7f7f7f7f;
    auVar42._24_4_ = 0x7f7f7f7f;
    auVar42._28_4_ = 0x7f7f7f7f;
    uVar20 = uVar36 & 0xffffffff;
    do {
      pvVar6 = A->data;
      lVar19 = A->w * lVar21 * A->elemsize;
      if (max_kk < 4) {
        lVar28 = (long)pvVar6 + lVar29 + uVar20;
        uVar35 = 0;
      }
      else {
        lVar28 = (long)pvVar6 + lVar10;
        lVar18 = (long)pvVar6 + lVar22;
        lVar11 = (long)pvVar6 + lVar32;
        lVar13 = (long)pvVar6 + lVar17;
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        iVar23 = 3;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
        do {
          pauVar8 = pauVar7;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(lVar28 + lVar19);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(lVar13 + lVar19);
          auVar45 = vpunpcklbw_avx(auVar45,auVar37);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar11 + lVar19);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(lVar18 + lVar19);
          auVar37 = vpunpcklbw_avx(auVar38,auVar49);
          auVar38 = vpunpcklwd_avx(auVar45,auVar37);
          auVar45 = vpunpckhwd_avx(auVar45,auVar37);
          auVar48._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar38;
          auVar48._16_16_ = ZEXT116(1) * auVar45;
          auVar39 = vpdpbusd_avx512_vnni(auVar40._0_32_,auVar42,auVar48);
          auVar40 = ZEXT3264(auVar39);
          *(undefined1 (*) [32])(pauVar8[-1] + 0x20) = auVar48;
          pauVar7 = (undefined1 (*) [64])(*pauVar8 + 0x20);
          lVar28 = lVar28 + lVar26;
          lVar18 = lVar18 + lVar26;
          lVar11 = lVar11 + lVar26;
          lVar13 = lVar13 + lVar26;
          iVar23 = iVar23 + 4;
        } while (iVar23 < max_kk);
        *(undefined1 (*) [32])*pauVar8 = auVar39;
        uVar35 = max_kk & 0xfffffffc;
      }
      puVar14 = (ulong *)(lVar28 + lVar19);
      uVar24 = uVar35 | 1;
      while ((int)uVar24 < max_kk) {
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *puVar14;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)puVar14 + lVar31);
        auVar45 = vpunpcklbw_avx(auVar43,auVar46);
        *(undefined1 (*) [16])*pauVar7 = auVar45;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
        puVar14 = (ulong *)((long)puVar14 + (long)(iVar9 * 2));
        uVar24 = uVar35 + 3;
        uVar35 = uVar35 + 2;
      }
      iVar23 = max_kk - uVar35;
      if (iVar23 != 0 && (int)uVar35 <= max_kk) {
        do {
          *(ulong *)*pauVar7 = *puVar14;
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 8);
          puVar14 = (ulong *)((long)puVar14 + lVar31);
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar36 = uVar20 + 8;
      lVar19 = uVar20 + 0xf;
      lVar10 = lVar10 + 8;
      lVar22 = lVar22 + 8;
      lVar32 = lVar32 + 8;
      lVar17 = lVar17 + 8;
      uVar20 = uVar36;
    } while (lVar19 < lVar34);
  }
  auVar45 = _DAT_005a67c0;
  if ((int)((uint)uVar36 | 3) < max_ii) {
    auVar37 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar37,_DAT_005a6250);
    auVar47._8_4_ = 0x7f7f7f7f;
    auVar47._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar47._12_4_ = 0x7f7f7f7f;
    uVar20 = uVar36 & 0xffffffff;
    do {
      puVar15 = (undefined1 *)((long)A->data + lVar29 + uVar20 + A->w * lVar21 * A->elemsize);
      uVar35 = 0;
      if (3 < max_kk) {
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        iVar23 = 3;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
        do {
          pauVar8 = pauVar7;
          auVar37 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
          auVar37 = vpgatherdd((undefined1  [16])0x0,auVar37);
          in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
          auVar37 = vpshufb_avx(auVar37,auVar45);
          auVar38 = vpdpbusd_avx512_vnni(auVar40._0_16_,auVar47,auVar37);
          auVar40 = ZEXT1664(auVar38);
          *(undefined1 (*) [16])(pauVar8[-1] + 0x30) = auVar37;
          puVar15 = puVar15 + lVar31 * 4;
          pauVar7 = (undefined1 (*) [64])(*pauVar8 + 0x10);
          iVar23 = iVar23 + 4;
        } while (iVar23 < max_kk);
        *(undefined1 (*) [16])*pauVar8 = auVar38;
        uVar35 = max_kk & 0xfffffffc;
      }
      uVar24 = uVar35 | 1;
      while ((int)uVar24 < max_kk) {
        (*pauVar7)[0] = *puVar15;
        (*pauVar7)[1] = puVar15[lVar31];
        (*pauVar7)[2] = puVar15[1];
        (*pauVar7)[3] = puVar15[iVar9 + 1];
        (*pauVar7)[4] = puVar15[2];
        (*pauVar7)[5] = puVar15[iVar9 + 2];
        (*pauVar7)[6] = puVar15[3];
        (*pauVar7)[7] = puVar15[iVar9 + 3];
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 8);
        puVar15 = puVar15 + lVar31 * 2;
        uVar24 = uVar35 + 3;
        uVar35 = uVar35 + 2;
      }
      iVar23 = max_kk - uVar35;
      if (iVar23 != 0 && (int)uVar35 <= max_kk) {
        puVar15 = puVar15 + 3;
        do {
          (*pauVar7)[0] = puVar15[-3];
          (*pauVar7)[1] = puVar15[-2];
          (*pauVar7)[2] = puVar15[-1];
          (*pauVar7)[3] = *puVar15;
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 4);
          puVar15 = puVar15 + lVar31;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar36 = uVar20 + 4;
      lVar10 = uVar20 + 7;
      uVar20 = uVar36;
    } while (lVar10 < lVar34);
  }
  uVar35 = (uint)uVar36;
  if ((int)(uVar35 | 1) < max_ii) {
    lVar26 = (long)(iVar9 * 4);
    lVar32 = lVar29 + (int)uVar35;
    lVar22 = (iVar9 * 3 + 1) + lVar32;
    lVar10 = lVar32 + (iVar9 + 1);
    lVar17 = iVar9 * 3 + lVar32;
    local_70 = lVar32 + iVar9 * 2;
    local_78 = lVar32 + lVar31;
    uVar20 = (long)(int)uVar35;
    do {
      pvVar6 = A->data;
      lVar19 = A->w * lVar21 * A->elemsize;
      if (max_kk < 4) {
        lVar28 = (long)pvVar6 + lVar29 + uVar20;
        uVar35 = 0;
      }
      else {
        lVar28 = (long)pvVar6 + lVar32;
        lVar18 = (long)pvVar6 + lVar22;
        lVar11 = (long)pvVar6 + lVar10;
        lVar13 = (long)pvVar6 + lVar17;
        lVar33 = (long)pvVar6 + local_70;
        lVar16 = (long)pvVar6 + local_78;
        iVar23 = 0;
        iVar25 = 3;
        iVar27 = 0;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 8);
        do {
          pauVar8 = pauVar7;
          cVar1 = *(char *)(lVar28 + lVar19);
          pauVar8[-1][0x38] = cVar1;
          cVar2 = *(char *)(lVar16 + lVar19);
          pauVar8[-1][0x39] = cVar2;
          cVar3 = *(char *)(lVar33 + lVar19);
          pauVar8[-1][0x3a] = cVar3;
          cVar4 = *(char *)(lVar13 + lVar19);
          pauVar8[-1][0x3b] = cVar4;
          cVar5 = *(char *)(lVar28 + 1 + lVar19);
          pauVar8[-1][0x3c] = cVar5;
          iVar27 = iVar27 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          cVar1 = *(char *)(lVar11 + lVar19);
          pauVar8[-1][0x3d] = cVar1;
          cVar2 = *(char *)(lVar33 + 1 + lVar19);
          pauVar8[-1][0x3e] = cVar2;
          cVar3 = *(char *)(lVar18 + lVar19);
          pauVar8[-1][0x3f] = cVar3;
          iVar23 = iVar23 + cVar5 + (int)cVar1 + (int)cVar2 + (int)cVar3;
          iVar25 = iVar25 + 4;
          lVar28 = lVar28 + lVar26;
          lVar18 = lVar18 + lVar26;
          pauVar7 = (undefined1 (*) [64])(*pauVar8 + 8);
          lVar11 = lVar11 + lVar26;
          lVar13 = lVar13 + lVar26;
          lVar33 = lVar33 + lVar26;
          lVar16 = lVar16 + lVar26;
        } while (iVar25 < max_kk);
        *(int *)*pauVar8 = iVar27 * 0x7f;
        *(int *)(*pauVar8 + 4) = iVar23 * 0x7f;
        uVar35 = max_kk & 0xfffffffc;
      }
      puVar15 = (undefined1 *)(lVar28 + lVar19);
      uVar24 = uVar35 | 1;
      while ((int)uVar24 < max_kk) {
        (*pauVar7)[0] = *puVar15;
        (*pauVar7)[1] = puVar15[lVar31];
        (*pauVar7)[2] = puVar15[1];
        (*pauVar7)[3] = puVar15[iVar9 + 1];
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 4);
        puVar15 = puVar15 + iVar9 * 2;
        uVar24 = uVar35 + 3;
        uVar35 = uVar35 + 2;
      }
      iVar23 = max_kk - uVar35;
      if (iVar23 != 0 && (int)uVar35 <= max_kk) {
        puVar15 = puVar15 + 1;
        do {
          (*pauVar7)[0] = puVar15[-1];
          (*pauVar7)[1] = *puVar15;
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 2);
          puVar15 = puVar15 + lVar31;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar36 = uVar20 + 2;
      lVar19 = uVar20 + 3;
      lVar32 = lVar32 + 2;
      lVar22 = lVar22 + 2;
      lVar10 = lVar10 + 2;
      lVar17 = lVar17 + 2;
      local_70 = local_70 + 2;
      local_78 = local_78 + 2;
      uVar20 = uVar36;
    } while (lVar19 < lVar34);
  }
  if ((int)uVar36 < max_ii) {
    lVar22 = (long)(iVar9 * 4);
    lVar17 = (long)(int)uVar36;
    lVar10 = lVar17 + lVar29;
    lVar19 = iVar9 * 3 + lVar10;
    lVar26 = iVar9 * 2 + lVar10;
    lVar32 = lVar10 + lVar31;
    do {
      pvVar6 = A->data;
      lVar28 = A->w * lVar21 * A->elemsize;
      if (max_kk < 4) {
        lVar18 = (long)pvVar6 + lVar29 + lVar17;
        uVar35 = 0;
      }
      else {
        lVar18 = lVar10 + (long)pvVar6;
        lVar11 = (long)pvVar6 + lVar19;
        lVar13 = (long)pvVar6 + lVar26;
        lVar33 = (long)pvVar6 + lVar32;
        iVar23 = 0;
        iVar9 = 3;
        pauVar7 = (undefined1 (*) [64])(*pauVar7 + 4);
        do {
          pauVar8 = pauVar7;
          cVar1 = *(char *)(lVar18 + lVar28);
          pauVar8[-1][0x3c] = cVar1;
          cVar2 = *(char *)(lVar33 + lVar28);
          pauVar8[-1][0x3d] = cVar2;
          cVar3 = *(char *)(lVar13 + lVar28);
          pauVar8[-1][0x3e] = cVar3;
          cVar4 = *(char *)(lVar11 + lVar28);
          pauVar8[-1][0x3f] = cVar4;
          iVar23 = iVar23 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          iVar9 = iVar9 + 4;
          lVar18 = lVar18 + lVar22;
          lVar11 = lVar11 + lVar22;
          lVar13 = lVar13 + lVar22;
          lVar33 = lVar33 + lVar22;
          pauVar7 = (undefined1 (*) [64])(*pauVar8 + 4);
        } while (iVar9 < max_kk);
        *(int *)*pauVar8 = iVar23 * 0x7f;
        uVar35 = max_kk & 0xfffffffc;
      }
      puVar15 = (undefined1 *)(lVar18 + lVar28);
      iVar9 = max_kk - uVar35;
      if (iVar9 != 0 && (int)uVar35 <= max_kk) {
        do {
          (*pauVar7)[0] = *puVar15;
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 1);
          puVar15 = puVar15 + lVar31;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      lVar17 = lVar17 + 1;
      lVar10 = lVar10 + 1;
      lVar19 = lVar19 + 1;
      lVar26 = lVar26 + 1;
      lVar32 = lVar32 + 1;
    } while (lVar17 != lVar34);
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx512vnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}